

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_sha2_rec(MDD mdd,SHA256_CTX *ctx)

{
  int iVar1;
  uint64_t uVar2;
  uint32_t local_24;
  mddnode_t pmStack_20;
  uint32_t val;
  mddnode_t node;
  SHA256_CTX *ctx_local;
  MDD mdd_local;
  
  node = (mddnode_t)ctx;
  ctx_local = (SHA256_CTX *)mdd;
  if (mdd < 2) {
    SHA256_Update((SHA256_CTX *)ctx,&ctx_local,8);
  }
  else {
    pmStack_20 = LDD_GETNODE(mdd);
    iVar1 = lddmc_mark(pmStack_20);
    if (iVar1 != 0) {
      local_24 = mddnode_getvalue(pmStack_20);
      SHA256_Update((SHA256_CTX *)node,&local_24,4);
      uVar2 = mddnode_getdown(pmStack_20);
      lddmc_sha2_rec(uVar2,(SHA256_CTX *)node);
      uVar2 = mddnode_getright(pmStack_20);
      lddmc_sha2_rec(uVar2,(SHA256_CTX *)node);
    }
  }
  return;
}

Assistant:

static void
lddmc_sha2_rec(MDD mdd, SHA256_CTX *ctx)
{
    if (mdd <= lddmc_true) {
        SHA256_Update(ctx, (void*)&mdd, sizeof(uint64_t));
        return;
    }

    mddnode_t node = LDD_GETNODE(mdd);
    if (lddmc_mark(node)) {
        uint32_t val = mddnode_getvalue(node);
        SHA256_Update(ctx, (void*)&val, sizeof(uint32_t));
        lddmc_sha2_rec(mddnode_getdown(node), ctx);
        lddmc_sha2_rec(mddnode_getright(node), ctx);
    }
}